

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O2

void __thiscall soplex::SPxOut::SPxOut(SPxOut *this,SPxOut *rhs)

{
  ostream *poVar1;
  long lVar2;
  
  this->_vptr_SPxOut = (_func_int **)&PTR__SPxOut_00331920;
  this->m_verbosity = rhs->m_verbosity;
  this->m_streams = (ostream **)0x0;
  spx_alloc<std::ostream**>(&this->m_streams,6);
  poVar1 = *rhs->m_streams;
  this->m_streams[1] = poVar1;
  *this->m_streams = poVar1;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    this->m_streams[lVar2 + 2] = rhs->m_streams[lVar2 + 2];
  }
  return;
}

Assistant:

SPxOut::SPxOut(const SPxOut& rhs)
{
   m_verbosity = rhs.m_verbosity;
   m_streams = nullptr;
   spx_alloc(m_streams, INFO3 + 1);
   m_streams = new(m_streams) std::ostream*[INFO3 + 1];
   m_streams[ ERROR ] = m_streams[ WARNING ] = rhs.m_streams[ERROR];

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = rhs.m_streams[ i ];
}